

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testDwaLookups.cpp
# Opt level: O1

void testLutHeader(void)

{
  undefined1 auVar1 [16];
  pointer ppLVar2;
  pointer ppLVar3;
  char cVar4;
  uint uVar5;
  long lVar6;
  LutHeaderWorker *pLVar7;
  Thread *this;
  undefined8 *__dest;
  ulong uVar8;
  size_t startValue;
  size_t __n;
  undefined8 *puVar9;
  ulong uVar10;
  ulong uVar11;
  value_type *ppLVar12;
  ulong uVar13;
  ulong uVar14;
  long lVar15;
  vector<(anonymous_namespace)::LutHeaderWorker_*,_std::allocator<(anonymous_namespace)::LutHeaderWorker_*>_>
  workers;
  undefined8 *local_68;
  undefined8 *local_60;
  vector<(anonymous_namespace)::LutHeaderWorker_*,_std::allocator<(anonymous_namespace)::LutHeaderWorker_*>_>
  local_58;
  LutHeaderWorker *local_38;
  
  local_58.
  super__Vector_base<(anonymous_namespace)::LutHeaderWorker_*,_std::allocator<(anonymous_namespace)::LutHeaderWorker_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.
  super__Vector_base<(anonymous_namespace)::LutHeaderWorker_*,_std::allocator<(anonymous_namespace)::LutHeaderWorker_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.
  super__Vector_base<(anonymous_namespace)::LutHeaderWorker_*,_std::allocator<(anonymous_namespace)::LutHeaderWorker_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cVar4 = IlmThread_3_2::supportsThreads();
  uVar10 = 1;
  if (cVar4 != '\0') {
    uVar5 = std::thread::hardware_concurrency();
    uVar10 = 1;
    if (1 < (int)uVar5) {
      uVar10 = (ulong)uVar5;
    }
  }
  startValue = 0;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = uVar10;
  lVar6 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x10000)) / auVar1,0);
  do {
    ppLVar12 = &local_38;
    if (uVar10 == 1) {
      pLVar7 = (LutHeaderWorker *)operator_new(0x30);
      anon_unknown.dwarf_14bc0f::LutHeaderWorker::LutHeaderWorker(pLVar7,startValue,0x10000);
      local_38 = pLVar7;
      std::
      vector<(anonymous_namespace)::LutHeaderWorker_*,_std::allocator<(anonymous_namespace)::LutHeaderWorker_*>_>
      ::push_back(&local_58,&local_38);
    }
    else {
      pLVar7 = (LutHeaderWorker *)operator_new(0x30);
      anon_unknown.dwarf_14bc0f::LutHeaderWorker::LutHeaderWorker
                (pLVar7,startValue,lVar6 + startValue);
      local_38 = pLVar7;
      std::
      vector<(anonymous_namespace)::LutHeaderWorker_*,_std::allocator<(anonymous_namespace)::LutHeaderWorker_*>_>
      ::push_back(&local_58,&local_38);
    }
    startValue = startValue + lVar6;
    uVar10 = uVar10 - 1;
  } while (uVar10 != 0);
  cVar4 = IlmThread_3_2::supportsThreads();
  ppLVar2 = local_58.
            super__Vector_base<(anonymous_namespace)::LutHeaderWorker_*,_std::allocator<(anonymous_namespace)::LutHeaderWorker_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (cVar4 == '\0') {
    if ((long)local_58.
              super__Vector_base<(anonymous_namespace)::LutHeaderWorker_*,_std::allocator<(anonymous_namespace)::LutHeaderWorker_*>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)local_58.
              super__Vector_base<(anonymous_namespace)::LutHeaderWorker_*,_std::allocator<(anonymous_namespace)::LutHeaderWorker_*>_>
              ._M_impl.super__Vector_impl_data._M_start != 0) {
      lVar6 = (long)local_58.
                    super__Vector_base<(anonymous_namespace)::LutHeaderWorker_*,_std::allocator<(anonymous_namespace)::LutHeaderWorker_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)local_58.
                    super__Vector_base<(anonymous_namespace)::LutHeaderWorker_*,_std::allocator<(anonymous_namespace)::LutHeaderWorker_*>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 3;
      lVar15 = 0;
      do {
        anon_unknown.dwarf_14bc0f::LutHeaderWorker::run(ppLVar2[lVar15],SUB81(ppLVar12,0));
        lVar15 = lVar15 + 1;
      } while (lVar6 + (ulong)(lVar6 == 0) != lVar15);
    }
  }
  else {
    if (local_58.
        super__Vector_base<(anonymous_namespace)::LutHeaderWorker_*,_std::allocator<(anonymous_namespace)::LutHeaderWorker_*>_>
        ._M_impl.super__Vector_impl_data._M_finish ==
        local_58.
        super__Vector_base<(anonymous_namespace)::LutHeaderWorker_*,_std::allocator<(anonymous_namespace)::LutHeaderWorker_*>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      uVar10 = 0;
      local_60 = (undefined8 *)0x0;
      local_68 = (undefined8 *)0x0;
    }
    else {
      uVar11 = 0;
      local_68 = (undefined8 *)0x0;
      local_60 = (undefined8 *)0x0;
      puVar9 = (undefined8 *)0x0;
      do {
        ppLVar2 = local_58.
                  super__Vector_base<(anonymous_namespace)::LutHeaderWorker_*,_std::allocator<(anonymous_namespace)::LutHeaderWorker_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        this = (Thread *)operator_new(0x48);
        pLVar7 = ppLVar2[uVar11];
        IlmThread_3_2::Thread::Thread(this);
        *(undefined ***)this = &PTR__Runner_001ec158;
        *(LutHeaderWorker **)(this + 0x10) = pLVar7;
        this[0x18] = (Thread)(uVar11 == 0);
        IlmThread_3_2::Semaphore::Semaphore((Semaphore *)(this + 0x20),0);
        IlmThread_3_2::Thread::start();
        if (puVar9 == local_60) {
          __n = (long)puVar9 - (long)local_68;
          if (__n == 0x7ffffffffffffff8) {
            std::__throw_length_error("vector::_M_realloc_insert");
          }
          uVar14 = (long)__n >> 3;
          uVar10 = 1;
          if (puVar9 != local_68) {
            uVar10 = uVar14;
          }
          uVar8 = uVar10 + uVar14;
          if (0xffffffffffffffe < uVar8) {
            uVar8 = 0xfffffffffffffff;
          }
          uVar13 = 0xfffffffffffffff;
          if (!CARRY8(uVar10,uVar14)) {
            uVar13 = uVar8;
          }
          if (uVar13 == 0) {
            __dest = (undefined8 *)0x0;
          }
          else {
            __dest = (undefined8 *)operator_new(uVar13 * 8);
          }
          __dest[uVar14] = this;
          if (0 < (long)__n) {
            memmove(__dest,local_68,__n);
          }
          if (local_68 != (undefined8 *)0x0) {
            operator_delete(local_68,(long)local_60 - (long)local_68);
          }
          puVar9 = (undefined8 *)(__n + (long)__dest);
          local_60 = __dest + uVar13;
          local_68 = __dest;
        }
        else {
          *puVar9 = this;
        }
        puVar9 = puVar9 + 1;
        uVar11 = uVar11 + 1;
        uVar10 = (long)local_58.
                       super__Vector_base<(anonymous_namespace)::LutHeaderWorker_*,_std::allocator<(anonymous_namespace)::LutHeaderWorker_*>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)local_58.
                       super__Vector_base<(anonymous_namespace)::LutHeaderWorker_*,_std::allocator<(anonymous_namespace)::LutHeaderWorker_*>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 3;
      } while (uVar11 < uVar10);
    }
    if (uVar10 != 0) {
      uVar11 = 0;
      do {
        if ((long *)local_68[uVar11] != (long *)0x0) {
          (**(code **)(*(long *)local_68[uVar11] + 8))();
        }
        uVar11 = uVar11 + 1;
      } while (uVar10 != uVar11);
    }
    if (local_68 != (undefined8 *)0x0) {
      operator_delete(local_68,(long)local_60 - (long)local_68);
    }
  }
  puts("test closestDataOffset[]");
  ppLVar3 = local_58.
            super__Vector_base<(anonymous_namespace)::LutHeaderWorker_*,_std::allocator<(anonymous_namespace)::LutHeaderWorker_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  ppLVar2 = local_58.
            super__Vector_base<(anonymous_namespace)::LutHeaderWorker_*,_std::allocator<(anonymous_namespace)::LutHeaderWorker_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puts("test closestData[]");
  if ((long)ppLVar3 - (long)ppLVar2 != 0) {
    lVar15 = (long)ppLVar3 - (long)ppLVar2 >> 3;
    lVar6 = 0;
    do {
      pLVar7 = ppLVar2[lVar6];
      if (pLVar7 != (LutHeaderWorker *)0x0) {
        if (pLVar7->_offset != (size_t *)0x0) {
          operator_delete__(pLVar7->_offset);
        }
        if (pLVar7->_elements != (unsigned_short *)0x0) {
          operator_delete__(pLVar7->_elements);
        }
        operator_delete(pLVar7,0x30);
      }
      lVar6 = lVar6 + 1;
    } while (lVar15 + (ulong)(lVar15 == 0) != lVar6);
  }
  if (ppLVar2 == (pointer)0x0) {
    return;
  }
  operator_delete(ppLVar2,(long)local_58.
                                super__Vector_base<(anonymous_namespace)::LutHeaderWorker_*,_std::allocator<(anonymous_namespace)::LutHeaderWorker_*>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppLVar2);
  return;
}

Assistant:

const size_t* offset () const { return _offset; }